

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       *this,ostream *o,bool pretty_print,uint indent_step,uint current_indent)

{
  double dVar1;
  ushort uVar2;
  int iVar3;
  ostream *poVar4;
  array_t *paVar5;
  object_t *poVar6;
  _Base_ptr p_Var7;
  DecimalSeparator *pDVar8;
  int iVar9;
  undefined7 in_register_00000011;
  char *pcVar10;
  long lVar11;
  stringstream *this_00;
  pointer this_01;
  undefined4 uVar12;
  locale local_218;
  undefined4 local_20c;
  undefined1 local_208 [32];
  char *local_1e8;
  uint local_1dc;
  char *local_1d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *local_1d0;
  locale local_1c8;
  locale local_1c0;
  stringstream ss;
  stringstream asStack_1b7 [15];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [88];
  
  uVar2 = (this->m_type).data;
  if (8 < ((byte)uVar2 & 0xf)) {
    return;
  }
  uVar12 = (undefined4)CONCAT71(in_register_00000011,pretty_print);
  switch(uVar2 & 0xf) {
  case 0:
    pcVar10 = "null";
    break;
  case 1:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.object != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x1787,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    if ((((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pcVar10 = "{}";
      break;
    }
    local_1dc = (uint)pretty_print;
    std::operator<<(o,"{");
    if (pretty_print) {
      current_indent = current_indent + indent_step;
      local_20c = uVar12;
      std::operator<<(o,"\n");
      local_1d8 = ",\n";
      local_1e8 = " ";
    }
    else {
      local_1d8 = ",";
      local_1e8 = "";
      local_20c = uVar12;
    }
    poVar6 = (this->m_value).object;
    p_Var7 = (poVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1d0 = this;
    while ((_Rb_tree_header *)p_Var7 != &(poVar6->_M_t)._M_impl.super__Rb_tree_header) {
      if (p_Var7 != (poVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        std::operator<<(o,local_1d8);
      }
      _ss = (pointer)&local_1a8;
      std::__cxx11::string::_M_construct((ulong)&ss,(char)current_indent);
      poVar4 = std::operator<<(o,(string *)&ss);
      poVar4 = std::operator<<(poVar4,"\"");
      escape_string((string_t *)local_208,(string_t *)(p_Var7 + 1));
      poVar4 = std::operator<<(poVar4,(string *)local_208);
      poVar4 = std::operator<<(poVar4,"\":");
      std::operator<<(poVar4,local_1e8);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)&ss);
      dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
            *)(p_Var7 + 2),o,SUB41(local_1dc,0),indent_step,current_indent);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      poVar6 = (local_1d0->m_value).object;
    }
    if ((char)local_20c != '\0') {
      current_indent = current_indent - indent_step;
      std::operator<<(o,"\n");
    }
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_208,(char)current_indent);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "}");
    std::operator<<(o,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    this_00 = (stringstream *)local_208;
    goto LAB_00106ead;
  case 2:
    paVar5 = (this->m_value).array;
    if (paVar5 == (array_t *)0x0) {
      __assert_fail("m_value.array != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17b1,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    if ((paVar5->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (paVar5->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar10 = "[]";
      break;
    }
    std::operator<<(o,"[");
    if (pretty_print) {
      current_indent = current_indent + indent_step;
      local_20c = uVar12;
      std::operator<<(o,"\n");
      local_1e8 = ",\n";
    }
    else {
      local_1e8 = ",";
      local_20c = uVar12;
    }
    paVar5 = (this->m_value).array;
    for (this_01 = (paVar5->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        (paVar5->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      if (this_01 !=
          (paVar5->
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(o,local_1e8);
      }
      _ss = (pointer)&local_1a8;
      std::__cxx11::string::_M_construct((ulong)&ss,(char)current_indent);
      std::operator<<(o,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      dump(this_01,o,pretty_print,indent_step,current_indent);
      paVar5 = (this->m_value).array;
    }
    if ((char)local_20c != '\0') {
      current_indent = current_indent - indent_step;
      std::operator<<(o,"\n");
    }
    _ss = (pointer)&local_1a8;
    std::__cxx11::string::_M_construct((ulong)&ss,(char)current_indent);
    poVar4 = std::operator<<(o,(string *)&ss);
    std::operator<<(poVar4,"]");
    goto LAB_00106d40;
  case 3:
    if ((this->m_value).object == (object_t *)0x0) {
      __assert_fail("m_value.string != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x17d9,
                    "void nlohmann::basic_json<>::dump(std::ostream &, const bool, const unsigned int, const unsigned int) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
    std::__cxx11::string::string((string *)&ss,"\"",(allocator *)&local_218);
    poVar4 = std::operator<<(o,(string *)&ss);
    escape_string((string_t *)local_208,(this->m_value).string);
    poVar4 = std::operator<<(poVar4,(string *)local_208);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string((string *)local_208);
LAB_00106d40:
    this_00 = &ss;
LAB_00106ead:
    std::__cxx11::string::~string((string *)this_00);
    return;
  case 4:
    pcVar10 = "false";
    if ((this->m_value).boolean != false) {
      pcVar10 = "true";
    }
    break;
  case 5:
    std::ostream::_M_insert<long>((long)o);
    return;
  case 6:
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    return;
  case 7:
    if ((uVar2 & 0x10) == 0) {
      dVar1 = (this->m_value).number_float;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        pcVar10 = "0.0";
        if ((long)dVar1 < 0) {
          pcVar10 = "-0.0";
        }
        break;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::locale::locale(&local_218);
      pDVar8 = (DecimalSeparator *)operator_new(0x18);
      anon_unknown_3::DecimalSeparator::DecimalSeparator(pDVar8);
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                ((locale *)local_208,&local_218,pDVar8);
      std::ios::imbue(&local_1c8);
      std::locale::~locale(&local_1c8);
      std::locale::~locale((locale *)local_208);
      std::locale::~locale(&local_218);
      *(undefined8 *)((long)&local_1a8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) =
           0xf;
      std::ostream::_M_insert<double>((this->m_value).number_float);
      std::__cxx11::stringbuf::str();
      std::operator<<(o,(string *)local_208);
    }
    else {
      if ((uVar2 & 0x20) != 0) {
        pcVar10 = "%.*E";
        if (-1 < (char)(byte)uVar2) {
          pcVar10 = "%.*e";
        }
        iVar3 = snprintf((char *)&ss,0x107,pcVar10,(this->m_value).object,(ulong)(uVar2 >> 8));
        if (((ushort)this->m_type & 0x40) == 0) {
          iVar9 = 0x106;
          if (iVar3 < 0x106) {
            iVar9 = iVar3;
          }
          for (iVar3 = 0; iVar3 <= iVar9; iVar3 = iVar3 + 1) {
            lVar11 = (long)iVar3;
            if (asStack_1b7[lVar11 + -1] == (stringstream)0x2b) {
              for (; iVar3 = iVar9, iVar9 != lVar11; lVar11 = lVar11 + 1) {
                asStack_1b7[lVar11 + -1] = asStack_1b7[lVar11];
              }
            }
          }
        }
        std::operator<<(o,(char *)&ss);
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::locale::locale(&local_218);
      pDVar8 = (DecimalSeparator *)operator_new(0x18);
      anon_unknown_3::DecimalSeparator::DecimalSeparator(pDVar8);
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                ((locale *)local_208,&local_218,pDVar8);
      std::ios::imbue(&local_1c0);
      std::locale::~locale(&local_1c0);
      std::locale::~locale((locale *)local_208);
      std::locale::~locale(&local_218);
      *(ulong *)((long)&local_1a8 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) =
           (ulong)*(byte *)((long)&this->m_type + 1);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xfffffefb | 4;
      std::ostream::_M_insert<double>((this->m_value).number_float);
      std::__cxx11::stringbuf::str();
      std::operator<<(o,(string *)local_208);
    }
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  case 8:
    pcVar10 = "<discarded>";
  }
  std::operator<<(o,pcVar10);
  return;
}

Assistant:

void dump(std::ostream& o,
                  const bool pretty_print,
                  const unsigned int indent_step,
                  const unsigned int current_indent = 0) const
        {
            // variable to hold indentation for recursive calls
            unsigned int new_indent = current_indent;

            switch (m_type)
            {
                case value_t::object:
                {
                    assert(m_value.object != nullptr);

                    if (m_value.object->empty())
                    {
                        o << "{}";
                        return;
                    }

                    o << "{";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.object->cbegin(); i != m_value.object->cend(); ++i)
                    {
                        if (i != m_value.object->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ') << "\""
                        << escape_string(i->first) << "\":"
                        << (pretty_print ? " " : "");
                        i->second.dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') + "}";
                    return;
                }

                case value_t::array:
                {
                    assert(m_value.array != nullptr);

                    if (m_value.array->empty())
                    {
                        o << "[]";
                        return;
                    }

                    o << "[";

                    // increase indentation
                    if (pretty_print)
                    {
                        new_indent += indent_step;
                        o << "\n";
                    }

                    for (auto i = m_value.array->cbegin(); i != m_value.array->cend(); ++i)
                    {
                        if (i != m_value.array->cbegin())
                        {
                            o << (pretty_print ? ",\n" : ",");
                        }
                        o << string_t(new_indent, ' ');
                        i->dump(o, pretty_print, indent_step, new_indent);
                    }

                    // decrease indentation
                    if (pretty_print)
                    {
                        new_indent -= indent_step;
                        o << "\n";
                    }

                    o << string_t(new_indent, ' ') << "]";
                    return;
                }

                case value_t::string:
                {
                    assert(m_value.string != nullptr);
                    o << string_t("\"") << escape_string(*m_value.string) << "\"";
                    return;
                }

                case value_t::boolean:
                {
                    o << (m_value.boolean ? "true" : "false");
                    return;
                }

                case value_t::number_integer:
                {
                    o << m_value.number_integer;
                    return;
                }

                case value_t::number_unsigned:
                {
                    o << m_value.number_unsigned;
                    return;
                }

                case value_t::number_float:
                {
                    // check if number was parsed from a string
                    if (m_type.bits.parsed)
                    {
                        // check if parsed number had an exponent given
                        if (m_type.bits.has_exp)
                        {
                            // buffer size: precision (2^8-1 = 255) + other ('-.e-xxx' = 7) + null (1)
                            char buf[263];
                            int len;

                            // handle capitalization of the exponent
                            if (m_type.bits.exp_cap)
                            {
                                len = snprintf(buf, sizeof(buf), "%.*E",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }
                            else
                            {
                                len = snprintf(buf, sizeof(buf), "%.*e",
                                               m_type.bits.precision, m_value.number_float) + 1;
                            }

                            // remove '+' sign from the exponent if necessary
                            if (not m_type.bits.exp_plus)
                            {
                                if (len > static_cast<int>(sizeof(buf)))
                                {
                                    len = sizeof(buf);
                                }
                                for (int i = 0; i < len; i++)
                                {
                                    if (buf[i] == '+')
                                    {
                                        for (; i + 1 < len; i++)
                                        {
                                            buf[i] = buf[i + 1];
                                        }
                                    }
                                }
                            }

                            o << buf;
                        }
                        else
                        {
                            // no exponent - output as a decimal
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(m_type.bits.precision)
                            << std::fixed << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    else
                    {
                        if (m_value.number_float == 0)
                        {
                            // special case for zero to get "0.0"/"-0.0"
                            o << (std::signbit(m_value.number_float) ? "-0.0" : "0.0");
                        }
                        else
                        {
                            // Otherwise 6, 15 or 16 digits of precision allows
                            // round-trip IEEE 754 string->float->string,
                            // string->double->string or string->long double->string;
                            // to be safe, we read this value from
                            // std::numeric_limits<number_float_t>::digits10
                            std::stringstream ss;
                            ss.imbue(std::locale(std::locale(), new DecimalSeparator));  // fix locale problems
                            ss << std::setprecision(std::numeric_limits<double>::digits10)
                            << m_value.number_float;
                            o << ss.str();
                        }
                    }
                    return;
                }

                case value_t::discarded:
                {
                    o << "<discarded>";
                    return;
                }

                case value_t::null:
                {
                    o << "null";
                    return;
                }
            }
        }